

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eLut.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int i;
  long lVar2;
  unsigned_short eLut [512];
  unsigned_short local_428 [512];
  
  initELut(local_428);
  std::operator<<((ostream *)&std::cout,
                  "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n");
  std::operator<<((ostream *)&std::cout,"{\n    ");
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 1) {
    *(undefined8 *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) = 5;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_428[lVar2]);
    std::operator<<(poVar1,", ");
    if ((~(uint)lVar2 & 7) == 0) {
      std::operator<<((ostream *)&std::cout,"\n");
      if (lVar2 != 0x1ff) {
        std::operator<<((ostream *)&std::cout,"    ");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int
main ()
{
    const int tableSize = 1 << 9;
    unsigned short eLut[tableSize];
    initELut (eLut);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    for (int i = 0; i < tableSize; i++)
    {
	cout << setw (5) << eLut[i] << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < tableSize - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}